

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b-ref.c
# Opt level: O2

int blake2b_init(blake2b_state *S,uint8_t outlen)

{
  blake2b_param P [1];
  blake2b_param local_48;
  
  if ((byte)(outlen + 0xbf) < 0xc0) {
    return -1;
  }
  local_48.key_length = '\0';
  local_48.fanout = '\x01';
  local_48.depth = '\x01';
  local_48._4_8_ = 0;
  local_48._12_8_ = 0;
  local_48.reserved[2] = '\0';
  local_48.reserved[3] = '\0';
  local_48.reserved[4] = '\0';
  local_48.reserved[5] = '\0';
  local_48.reserved[6] = '\0';
  local_48.reserved[7] = '\0';
  local_48.reserved[8] = '\0';
  local_48.reserved[9] = '\0';
  local_48.reserved[10] = '\0';
  local_48.reserved[0xb] = '\0';
  local_48.reserved[0xc] = '\0';
  local_48.reserved[0xd] = '\0';
  local_48.salt[0] = '\0';
  local_48.salt[1] = '\0';
  local_48.salt[2] = '\0';
  local_48.salt[3] = '\0';
  local_48.salt[4] = '\0';
  local_48.salt[5] = '\0';
  local_48.salt[6] = '\0';
  local_48.salt[7] = '\0';
  local_48.salt[8] = '\0';
  local_48.salt[9] = '\0';
  local_48.salt[10] = '\0';
  local_48.salt[0xb] = '\0';
  local_48.salt[0xc] = '\0';
  local_48.salt[0xd] = '\0';
  local_48.salt[0xe] = '\0';
  local_48.salt[0xf] = '\0';
  local_48.personal[0] = '\0';
  local_48.personal[1] = '\0';
  local_48.personal[2] = '\0';
  local_48.personal[3] = '\0';
  local_48.personal[4] = '\0';
  local_48.personal[5] = '\0';
  local_48.personal[6] = '\0';
  local_48.personal[7] = '\0';
  local_48.personal[8] = '\0';
  local_48.personal[9] = '\0';
  local_48.personal[10] = '\0';
  local_48.personal[0xb] = '\0';
  local_48.personal[0xc] = '\0';
  local_48.personal[0xd] = '\0';
  local_48.personal[0xe] = '\0';
  local_48.personal[0xf] = '\0';
  local_48.digest_length = outlen;
  blake2b_init_param(S,&local_48);
  return 0;
}

Assistant:

int blake2b_init( blake2b_state *S, const uint8_t outlen )
{
  blake2b_param P[1];

  if ( ( !outlen ) || ( outlen > BLAKE2B_OUTBYTES ) ) return -1;

  P->digest_length = outlen;
  P->key_length    = 0;
  P->fanout        = 1;
  P->depth         = 1;
  store32( &P->leaf_length, 0 );
  store64( &P->node_offset, 0 );
  P->node_depth    = 0;
  P->inner_length  = 0;
  memset( P->reserved, 0, sizeof( P->reserved ) );
  memset( P->salt,     0, sizeof( P->salt ) );
  memset( P->personal, 0, sizeof( P->personal ) );
  return blake2b_init_param( S, P );
}